

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  string *psVar1;
  bool bVar2;
  uint uVar3;
  string *psVar4;
  ostream *poVar5;
  long *plVar6;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  size_type *psVar10;
  long *plVar11;
  size_type *psVar12;
  ulong uVar13;
  _Alloc_hider _Var14;
  int iVar15;
  int iVar16;
  undefined1 local_1160 [8];
  ToolOptions options;
  ofstream dst;
  long local_fd0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_fc8 [14];
  ios_base local_ee8 [760];
  undefined1 local_bf0 [8];
  ProgramResult result;
  size_type **local_a68;
  undefined8 local_a60;
  code *local_a58;
  code *local_a50;
  string *local_a48;
  undefined8 local_a40;
  code *local_a38;
  code *local_a30;
  bool *local_a28;
  undefined8 local_a20;
  code *local_a18;
  code *local_a10;
  bool *local_a08;
  undefined8 local_a00;
  code *local_9f8;
  code *local_9f0;
  bool *local_9e8;
  undefined8 local_9e0;
  code *local_9d8;
  code *local_9d0;
  bool *local_9c8;
  undefined8 local_9c0;
  code *local_9b8;
  code *local_9b0;
  char *local_9a8;
  undefined8 local_9a0;
  code *local_998;
  code *local_990;
  size_type **local_988;
  undefined8 local_980;
  code *local_978;
  code *local_970;
  undefined8 local_968;
  undefined8 uStack_960;
  code *local_958;
  code *local_950;
  undefined8 local_948;
  undefined8 uStack_940;
  code *local_938;
  code *local_930;
  undefined8 local_928;
  undefined8 uStack_920;
  code *local_918;
  code *local_910;
  long *local_908 [2];
  long local_8f8 [2];
  long *local_8e8 [2];
  long local_8d8 [2];
  long *local_8c8 [2];
  long local_8b8 [2];
  long *local_8a8 [2];
  long local_898 [2];
  long *local_888 [2];
  long local_878 [2];
  string local_868;
  string local_848;
  string local_828;
  long *local_808 [2];
  long local_7f8 [2];
  string local_7e8;
  string local_7c8;
  string local_7a8;
  string local_788;
  string local_768;
  long *local_748 [2];
  long local_738 [2];
  long *local_728 [2];
  long local_718 [2];
  long *local_708 [2];
  long local_6f8 [2];
  long *local_6e8 [2];
  long local_6d8 [2];
  long *local_6c8 [2];
  long local_6b8 [2];
  long *local_6a8 [2];
  long local_698 [2];
  char *local_688;
  string binDir;
  size_type *local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> cmd;
  undefined1 local_638;
  undefined7 uStack_637;
  undefined1 *local_628;
  undefined8 local_620;
  undefined1 local_618;
  undefined7 uStack_617;
  undefined1 *local_608;
  undefined8 local_600;
  undefined1 local_5f8;
  undefined7 uStack_5f7;
  long *local_5e8 [2];
  long local_5d8 [2];
  long *local_5c8 [2];
  long local_5b8 [2];
  long *local_5a8 [2];
  long local_598 [2];
  long *local_588 [2];
  long local_578 [2];
  long *local_568 [2];
  long local_558 [2];
  long *local_548 [2];
  long local_538 [2];
  long *local_528 [2];
  long local_518 [2];
  long *local_508 [2];
  long local_4f8 [2];
  long *local_4e8 [2];
  long local_4d8 [2];
  long *local_4c8 [2];
  long local_4b8 [2];
  long *local_4a8 [2];
  long local_498 [2];
  long *local_488 [2];
  long local_478 [2];
  long *local_468 [2];
  long local_458 [2];
  long *local_448 [2];
  long local_438 [2];
  long *local_428 [2];
  long local_418 [2];
  long *local_408 [2];
  long local_3f8 [2];
  long *local_3e8 [2];
  long local_3d8 [2];
  long *local_3c8 [2];
  long local_3b8 [2];
  long *local_3a8 [2];
  long local_398 [2];
  long *local_388 [2];
  long local_378 [2];
  long *local_368 [2];
  long local_358 [2];
  long *local_348 [2];
  long local_338 [2];
  long *local_328 [2];
  long local_318 [2];
  long *local_308 [2];
  long local_2f8 [2];
  long *local_2e8 [2];
  long local_2d8 [2];
  long *local_2c8 [2];
  long local_2b8 [2];
  long *local_2a8 [2];
  long local_298 [2];
  string local_288;
  long *local_268 [2];
  long local_258 [2];
  string local_248;
  string local_228;
  long *local_208 [2];
  long local_1f8 [2];
  long *local_1e8 [2];
  long local_1d8 [2];
  code **local_1c8;
  undefined8 local_1c0;
  code *local_1b8;
  code *local_1b0;
  undefined1 local_1a8 [8];
  ProgramResult resultOnInvalid;
  anon_class_8_1_a7eb7a0b stopIfNotForced;
  long local_168 [2];
  size_type *local_158;
  string input;
  ProgramResult resultOnValid;
  string command;
  string WasmReduceOption;
  string test;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  size_type *local_88;
  string working;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  char **local_48;
  ulong local_40;
  bool local_35;
  bool local_34;
  bool local_33;
  char local_32;
  bool local_31 [4];
  bool deNan;
  bool verbose;
  bool debugInfo;
  bool force;
  bool binary;
  
  local_158 = &input._M_string_length;
  input._M_dataplus._M_p = (pointer)0x0;
  input._M_string_length._0_1_ = 0;
  WasmReduceOption.field_2._8_8_ = &test._M_string_length;
  test._M_dataplus._M_p = (pointer)0x0;
  test._M_string_length._0_1_ = 0;
  local_88 = &working._M_string_length;
  working._M_dataplus._M_p = (pointer)0x0;
  working._M_string_length._0_1_ = 0;
  resultOnValid.time = (double)&command._M_string_length;
  command._M_dataplus._M_p = (pointer)0x0;
  command._M_string_length._0_1_ = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&options.enabledFeatures,*argv,(allocator<char> *)local_bf0);
  wasm::Path::getDirName((string *)&local_688);
  if ((long *)options._376_8_ != &local_fd0) {
    operator_delete((void *)options._376_8_,local_fd0 + 1);
  }
  local_31[0] = true;
  local_35 = false;
  local_34 = false;
  local_33 = false;
  local_32 = '\0';
  command.field_2._8_8_ = &WasmReduceOption._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&command.field_2 + 8),"wasm-reduce options","");
  options._376_8_ = &local_fd0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&options.enabledFeatures,"wasm-reduce","");
  psVar1 = &result.output;
  local_bf0 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_bf0,
             "Reduce a wasm file to a smaller one with the same behavior on a given command.\n\nTypical usage:\n\n  wasm-reduce orig.wasm \'--command=bash a.sh\' --test t.wasm --working w.wasm\n\nThe original file orig.wasm is where we begin. We then repeatedly test a small\nreduction of it by writing that modification to the \'test file\' (specified by\n\'--test\'), and we run the command, in this example \'bash a.sh\'. That command\nshould use the test file (and not the original file or any other one). Whenever\nthe reduction works, we write that new smaller file to the \'working file\'\n(specified by \'--working\'). The reduction \'works\' if it correctly preserves the\nbehavior of the command on the original input, specifically, that it has the\nsame stdout and the result return code. Each time reduction works we continue to\nreduce from that point (and each time it fails, we go back and try something\nelse).\n\nAs mentioned above, the command should run on the test file. That is, the first\nthing that wasm-reduce does on the example above is, effectively,\n\n  cp orig.wasm t.wasm\n  bash a.sh\n\nIn other words, it copies the original to the test file, and runs the command.\nWhatever the command does, we will preserve as we copy progressively smaller\nfiles to t.wasm. As we make progress, the smallest file will be written to\nthe working file, w.wasm, and when reduction is done you will find the final\nresult there.\n\nComparison to creduce:\n\n1. creduce requires the command to return 0. wasm-reduce is often used to reduce\n   crashes, which have non-zero return codes, so it is natural to allow any\n   return code. As mentioned above, we preserve the return code as we reduce.\n2. creduce ignores stdout. wasm-reduce preserves stdout as it reduces, as part\n   of the principle of preserving the original behavior of the command (if your\n   stdout varies in uninteresting ways, your command can be a script that runs\n   the real command and captures stdout to /dev/null, or filters it).\n3. creduce tramples the original input file as it reduces. wasm-reduce never\n   modifies th..." /* TRUNCATED STRING LITERAL */
             ,"");
  wasm::ToolOptions::ToolOptions
            ((ToolOptions *)local_1160,(string *)&options.enabledFeatures,(string *)local_bf0);
  if (local_bf0 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_bf0,(ulong)(result.output._M_dataplus._M_p + 1));
  }
  if ((long *)options._376_8_ != &local_fd0) {
    operator_delete((void *)options._376_8_,local_fd0 + 1);
  }
  options._376_8_ = &local_fd0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&options.enabledFeatures,"--command","")
  ;
  local_bf0 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_bf0,"-cmd","");
  local_40 = CONCAT44(local_40._4_4_,argc);
  local_660 = &cmd._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_660,
             "The command to run on the test, that we want to reduce while keeping the command\'s output identical. We look at the command\'s return code and stdout here (TODO: stderr), and we reduce while keeping those unchanged."
             ,"");
  resultOnInvalid.code = 0;
  resultOnInvalid._4_4_ = 0;
  local_1a8 = (undefined1  [8])&resultOnValid.time;
  resultOnInvalid.output._M_string_length =
       (size_type)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1317:10)>
       ::_M_invoke;
  resultOnInvalid.output._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1317:10)>
                ::_M_manager;
  psVar4 = (string *)
           wasm::Options::add((string *)&options,(string *)&options.enabledFeatures,
                              (string *)local_bf0,(string *)&local_660,(int)&command + 0x18,
                              (function *)0x1,SUB81(local_1a8,0));
  input.field_2._8_8_ = &resultOnValid.output;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&input.field_2 + 8),"--test","");
  working.field_2._8_8_ = &local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&working.field_2 + 8),"-t","");
  test.field_2._8_8_ = &local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&test.field_2 + 8),
             "Test file (this will be written to test, the given command should read it when we call it)"
             ,"");
  local_1c0 = 0;
  local_1c8 = (code **)((long)&WasmReduceOption.field_2 + 8);
  local_1b0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1324:10)>
              ::_M_invoke;
  local_1b8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1324:10)>
              ::_M_manager;
  psVar4 = (string *)
           wasm::Options::add(psVar4,(string *)(input.field_2._M_local_buf + 8),
                              (string *)(working.field_2._M_local_buf + 8),
                              (string *)(test.field_2._M_local_buf + 8),(int)&command + 0x18,
                              (function *)0x1,SUB81(&local_1c8,0));
  resultOnInvalid.time = (double)local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)&resultOnInvalid.time,"--working","");
  local_5e8[0] = local_5d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"-w","");
  local_5c8[0] = local_5b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5c8,
             "Working file (this will contain the current good state while doing temporary computations, and will contain the final best result at the end)"
             ,"");
  local_a60 = 0;
  local_a68 = &local_88;
  local_a50 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1332:10)>
              ::_M_invoke;
  local_a58 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1332:10)>
              ::_M_manager;
  psVar4 = (string *)
           wasm::Options::add(psVar4,(string *)&resultOnInvalid.time,(string *)local_5e8,
                              (string *)local_5c8,(int)&command + 0x18,(function *)0x1,
                              SUB81(&local_a68,0));
  local_5a8[0] = local_598;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5a8,"--binaries","");
  local_588[0] = local_578;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"-b","");
  local_568[0] = local_558;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_568,"binaryen binaries location (bin/ directory)","");
  local_a40 = 0;
  local_a30 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1338:10)>
              ::_M_invoke;
  local_a38 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1338:10)>
              ::_M_manager;
  local_a48 = (string *)&local_688;
  psVar4 = (string *)
           wasm::Options::add(psVar4,(string *)local_5a8,(string *)local_588,(string *)local_568,
                              (int)&command + 0x18,(function *)0x1,SUB81(&local_a48,0));
  local_548[0] = local_538;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"--text","");
  local_528[0] = local_518;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"-S","");
  local_508[0] = local_4f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_508,
             "Emit intermediate files as text, instead of binary (also make sure the test and working files have a .wat or .wast suffix)"
             ,"");
  local_a20 = 0;
  local_a28 = local_31;
  local_a10 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1348:10)>
              ::_M_invoke;
  local_a18 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1348:10)>
              ::_M_manager;
  psVar4 = (string *)
           wasm::Options::add(psVar4,(string *)local_548,(string *)local_528,(string *)local_508,
                              (int)&command + 0x18,(function *)0x0,SUB81(&local_a28,0));
  local_4e8[0] = local_4d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"--denan","");
  local_4c8[0] = local_4b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"");
  local_4a8[0] = local_498;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"Avoid nans when reducing","")
  ;
  local_a00 = 0;
  local_a08 = &local_35;
  local_9f0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1354:10)>
              ::_M_invoke;
  local_9f8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1354:10)>
              ::_M_manager;
  psVar4 = (string *)
           wasm::Options::add(psVar4,(string *)local_4e8,(string *)local_4c8,(string *)local_4a8,
                              (int)&command + 0x18,(function *)0x0,SUB81(&local_a08,0));
  local_488[0] = local_478;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"--verbose","");
  local_468[0] = local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"-v","");
  local_448[0] = local_438;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"Verbose output mode","");
  local_9e0 = 0;
  local_9e8 = &local_34;
  local_9d0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1360:10)>
              ::_M_invoke;
  local_9d8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1360:10)>
              ::_M_manager;
  psVar4 = (string *)
           wasm::Options::add(psVar4,(string *)local_488,(string *)local_468,(string *)local_448,
                              (int)&command + 0x18,(function *)0x0,SUB81(&local_9e8,0));
  local_428[0] = local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"--debugInfo","");
  local_408[0] = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"-g","");
  local_3e8[0] = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3e8,"Keep debug info in binaries","");
  local_9c0 = 0;
  local_9c8 = &local_33;
  local_9b0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1366:10)>
              ::_M_invoke;
  local_9b8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1366:10)>
              ::_M_manager;
  psVar4 = (string *)
           wasm::Options::add(psVar4,(string *)local_428,(string *)local_408,(string *)local_3e8,
                              (int)&command + 0x18,(function *)0x0,SUB81(&local_9c8,0));
  local_3c8[0] = local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"--force","");
  local_3a8[0] = local_398;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"-f","");
  local_388[0] = local_378;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_388,
             "Force the reduction attempt, ignoring problems that imply it is unlikely to succeed",
             "");
  local_9a0 = 0;
  local_9a8 = &local_32;
  local_990 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1373:10)>
              ::_M_invoke;
  local_998 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1373:10)>
              ::_M_manager;
  psVar4 = (string *)
           wasm::Options::add(psVar4,(string *)local_3c8,(string *)local_3a8,(string *)local_388,
                              (int)&command + 0x18,(function *)0x0,SUB81(&local_9a8,0));
  local_368[0] = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"--timeout","");
  local_348[0] = local_338;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"-to","");
  local_328[0] = local_318;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_328,
             "A timeout to apply to each execution of the command, in seconds (default: 2)","");
  local_968 = 0;
  uStack_960 = 0;
  local_950 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1380:10)>
              ::_M_invoke;
  local_958 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1380:10)>
              ::_M_manager;
  psVar4 = (string *)
           wasm::Options::add(psVar4,(string *)local_368,(string *)local_348,(string *)local_328,
                              (int)&command + 0x18,(function *)0x1,SUB81(&local_968,0));
  local_308[0] = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"--extra-flags","");
  local_2e8[0] = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"-ef","");
  local_2c8[0] = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2c8,
             "Extra commandline flags to pass to wasm-opt while reducing. (default: --enable-all)",
             "");
  local_948 = 0;
  uStack_940 = 0;
  local_930 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1390:10)>
              ::_M_invoke;
  local_938 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1390:10)>
              ::_M_manager;
  local_48 = argv;
  psVar4 = (string *)
           wasm::Options::add(psVar4,(string *)local_308,(string *)local_2e8,(string *)local_2c8,
                              (int)&command + 0x18,(function *)0x1,SUB81(&local_948,0));
  local_908[0] = local_8f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_908,"--save-all-working","");
  local_2a8[0] = local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"-saw","");
  local_8e8[0] = local_8d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8e8,"Save all intermediate working files, as $WORKING.0, .1, .2 etc",""
            );
  local_928 = 0;
  uStack_920 = 0;
  local_910 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1399:10)>
              ::_M_invoke;
  local_918 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1399:10)>
              ::_M_manager;
  psVar4 = (string *)
           wasm::Options::add(psVar4,(string *)local_908,(string *)local_2a8,(string *)local_8e8,
                              (int)&command + 0x18,(function *)0x0,SUB81(&local_928,0));
  local_8c8[0] = local_8b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c8,"INFILE","");
  local_980 = 0;
  local_988 = &local_158;
  local_970 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1406:7)>
              ::_M_invoke;
  local_978 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp:1406:7)>
              ::_M_manager;
  wasm::Options::add_positional(psVar4,(Arguments)local_8c8,(function *)0x1);
  if (local_978 != (code *)0x0) {
    (*local_978)(&local_988,&local_988,3);
  }
  if (local_8c8[0] != local_8b8) {
    operator_delete(local_8c8[0],local_8b8[0] + 1);
  }
  if (local_918 != (code *)0x0) {
    (*local_918)(&local_928,&local_928,3);
  }
  if (local_8e8[0] != local_8d8) {
    operator_delete(local_8e8[0],local_8d8[0] + 1);
  }
  psVar12 = &cmd._M_string_length;
  if (local_2a8[0] != local_298) {
    operator_delete(local_2a8[0],local_298[0] + 1);
  }
  if (local_908[0] != local_8f8) {
    operator_delete(local_908[0],local_8f8[0] + 1);
  }
  if (local_938 != (code *)0x0) {
    (*local_938)(&local_948,&local_948,3);
  }
  if (local_2c8[0] != local_2b8) {
    operator_delete(local_2c8[0],local_2b8[0] + 1);
  }
  if (local_2e8[0] != local_2d8) {
    operator_delete(local_2e8[0],local_2d8[0] + 1);
  }
  if (local_308[0] != local_2f8) {
    operator_delete(local_308[0],local_2f8[0] + 1);
  }
  if (local_958 != (code *)0x0) {
    (*local_958)(&local_968,&local_968,3);
  }
  if (local_328[0] != local_318) {
    operator_delete(local_328[0],local_318[0] + 1);
  }
  if (local_348[0] != local_338) {
    operator_delete(local_348[0],local_338[0] + 1);
  }
  if (local_368[0] != local_358) {
    operator_delete(local_368[0],local_358[0] + 1);
  }
  if (local_998 != (code *)0x0) {
    (*local_998)(&local_9a8,&local_9a8,3);
  }
  if (local_388[0] != local_378) {
    operator_delete(local_388[0],local_378[0] + 1);
  }
  if (local_3a8[0] != local_398) {
    operator_delete(local_3a8[0],local_398[0] + 1);
  }
  if (local_3c8[0] != local_3b8) {
    operator_delete(local_3c8[0],local_3b8[0] + 1);
  }
  if (local_9b8 != (code *)0x0) {
    (*local_9b8)(&local_9c8,&local_9c8,3);
  }
  if (local_3e8[0] != local_3d8) {
    operator_delete(local_3e8[0],local_3d8[0] + 1);
  }
  if (local_408[0] != local_3f8) {
    operator_delete(local_408[0],local_3f8[0] + 1);
  }
  if (local_428[0] != local_418) {
    operator_delete(local_428[0],local_418[0] + 1);
  }
  if (local_9d8 != (code *)0x0) {
    (*local_9d8)(&local_9e8,&local_9e8,3);
  }
  if (local_448[0] != local_438) {
    operator_delete(local_448[0],local_438[0] + 1);
  }
  if (local_468[0] != local_458) {
    operator_delete(local_468[0],local_458[0] + 1);
  }
  if (local_488[0] != local_478) {
    operator_delete(local_488[0],local_478[0] + 1);
  }
  if (local_9f8 != (code *)0x0) {
    (*local_9f8)(&local_a08,&local_a08,3);
  }
  if (local_4a8[0] != local_498) {
    operator_delete(local_4a8[0],local_498[0] + 1);
  }
  if (local_4c8[0] != local_4b8) {
    operator_delete(local_4c8[0],local_4b8[0] + 1);
  }
  if (local_4e8[0] != local_4d8) {
    operator_delete(local_4e8[0],local_4d8[0] + 1);
  }
  if (local_a18 != (code *)0x0) {
    (*local_a18)(&local_a28,&local_a28,3);
  }
  if (local_508[0] != local_4f8) {
    operator_delete(local_508[0],local_4f8[0] + 1);
  }
  if (local_528[0] != local_518) {
    operator_delete(local_528[0],local_518[0] + 1);
  }
  if (local_548[0] != local_538) {
    operator_delete(local_548[0],local_538[0] + 1);
  }
  if (local_a38 != (code *)0x0) {
    (*local_a38)(&local_a48,&local_a48,3);
  }
  if (local_568[0] != local_558) {
    operator_delete(local_568[0],local_558[0] + 1);
  }
  if (local_588[0] != local_578) {
    operator_delete(local_588[0],local_578[0] + 1);
  }
  if (local_5a8[0] != local_598) {
    operator_delete(local_5a8[0],local_598[0] + 1);
  }
  if (local_a58 != (code *)0x0) {
    (*local_a58)(&local_a68,&local_a68,3);
  }
  if (local_5c8[0] != local_5b8) {
    operator_delete(local_5c8[0],local_5b8[0] + 1);
  }
  if (local_5e8[0] != local_5d8) {
    operator_delete(local_5e8[0],local_5d8[0] + 1);
  }
  if ((long *)resultOnInvalid.time != local_168) {
    operator_delete((void *)resultOnInvalid.time,local_168[0] + 1);
  }
  if (local_1b8 != (code *)0x0) {
    (*local_1b8)(&local_1c8,&local_1c8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test.field_2._8_8_ != &local_98) {
    operator_delete((void *)test.field_2._8_8_,local_98._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)working.field_2._8_8_ != &local_58) {
    operator_delete((void *)working.field_2._8_8_,local_58._M_allocated_capacity + 1);
  }
  if ((string *)input.field_2._8_8_ != &resultOnValid.output) {
    operator_delete((void *)input.field_2._8_8_,(ulong)(resultOnValid.output._M_dataplus._M_p + 1));
  }
  if (resultOnInvalid.output._M_dataplus._M_p != (pointer)0x0) {
    (*(code *)resultOnInvalid.output._M_dataplus._M_p)(local_1a8,local_1a8,3);
  }
  if (local_660 != psVar12) {
    operator_delete(local_660,cmd._M_string_length + 1);
  }
  if (local_bf0 != (undefined1  [8])&result.output) {
    operator_delete((void *)local_bf0,(ulong)(result.output._M_dataplus._M_p + 1));
  }
  if ((long *)options._376_8_ != &local_fd0) {
    operator_delete((void *)options._376_8_,local_fd0 + 1);
  }
  wasm::Options::parse((int)&options,(char **)(local_40 & 0xffffffff));
  if (local_33 == true) {
    std::__cxx11::string::append((char *)&extraFlags_abi_cxx11_);
  }
  if (test._M_dataplus._M_p == (pointer)0x0) {
    wasm::Fatal::Fatal((Fatal *)&options.enabledFeatures);
    wasm::Fatal::operator<<
              ((Fatal *)&options.enabledFeatures,(char (*) [24])"test file not provided\n");
LAB_00113262:
    wasm::Fatal::~Fatal((Fatal *)&options.enabledFeatures);
  }
  if (working._M_dataplus._M_p == (pointer)0x0) {
    wasm::Fatal::Fatal((Fatal *)&options.enabledFeatures);
    wasm::Fatal::operator<<
              ((Fatal *)&options.enabledFeatures,(char (*) [27])"working file not provided\n");
    goto LAB_00113262;
  }
  if (local_31[0] == false) {
    Colors::setEnabled(false);
  }
  wasm::Path::setBinaryenBinDir((string *)&local_688);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"|wasm-reduce\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"|input: ",8);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)local_158,(long)input._M_dataplus._M_p);
  options.enabledFeatures.features._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&options.enabledFeatures,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"|test: ",7);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)WasmReduceOption.field_2._8_8_,
                      (long)test._M_dataplus._M_p);
  options.enabledFeatures.features._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&options.enabledFeatures,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"|working: ",10);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)local_88,(long)working._M_dataplus._M_p);
  options.enabledFeatures.features._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&options.enabledFeatures,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"|bin dir: ",10);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_688,(long)binDir._M_dataplus._M_p);
  options.enabledFeatures.features._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&options.enabledFeatures,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"|extra flags: ",0xe);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,extraFlags_abi_cxx11_._M_dataplus._M_p,
                      extraFlags_abi_cxx11_._M_string_length);
  options.enabledFeatures.features._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&options.enabledFeatures,1);
  local_8a8[0] = local_898;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_8a8,local_158,input._M_dataplus._M_p + (long)local_158);
  local_888[0] = local_878;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_888,WasmReduceOption.field_2._8_8_,
             test._M_dataplus._M_p + WasmReduceOption.field_2._8_8_);
  wasm::copy_file(local_8a8,local_888);
  if (local_888[0] != local_878) {
    operator_delete(local_888[0],local_878[0] + 1);
  }
  if (local_8a8[0] != local_898) {
    operator_delete(local_8a8[0],local_898[0] + 1);
  }
  local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_868,resultOnValid.time,
             command._M_dataplus._M_p + (long)resultOnValid.time);
  ProgramResult::getFromExecution(&expected,&local_868);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868._M_dataplus._M_p != &local_868.field_2) {
    operator_delete(local_868._M_dataplus._M_p,local_868.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"|expected result:\n",0x12);
  ProgramResult::dump(&expected,(ostream *)&std::cerr);
  options.enabledFeatures.features._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,(char *)&options.enabledFeatures,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"|!! Make sure the above is what you expect! !!\n\n",0x30);
  resultOnInvalid.time = (double)&local_32;
  if (((double)CONCAT44(0x45300000,(int)(timeout >> 0x20)) - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)timeout) - 4503599627370496.0) <= expected.time + 1.0) {
    local_848._M_dataplus._M_p = (pointer)&local_848.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_848,
               "execution time is dangerously close to the timeout - you should probably increase the timeout"
               ,"");
    main::anon_class_8_1_a7eb7a0b::operator()
              ((anon_class_8_1_a7eb7a0b *)&resultOnInvalid.time,&local_848,&expected);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_848._M_dataplus._M_p != &local_848.field_2) {
      operator_delete(local_848._M_dataplus._M_p,local_848.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_32 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "|checking that command has different behavior on different inputs (this verifies that the test file is used by the command)\n"
               ,0x7c);
    std::ofstream::ofstream
              (&options.enabledFeatures,(string *)(WasmReduceOption.field_2._M_local_buf + 8),_S_bin
              );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&options.enabledFeatures,"waka waka\n",10);
    options.enabledFeatures.features = _VTT;
    options.disabledFeatures.features = std::ofstream::VTT_4;
    *(undefined8 *)((long)&options.enabledFeatures.features + *(long *)(_VTT + -0x18)) = _str;
    std::filebuf::~filebuf((filebuf *)&dst);
    std::ios_base::~ios_base(local_ee8);
    local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_828,resultOnValid.time,
               command._M_dataplus._M_p + (long)resultOnValid.time);
    ProgramResult::ProgramResult((ProgramResult *)local_1a8,&local_828);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_828._M_dataplus._M_p != &local_828.field_2) {
      operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1);
    }
    bVar2 = ProgramResult::operator==((ProgramResult *)local_1a8,&expected);
    if (bVar2) {
      wasm::Module::Module((Module *)&options.enabledFeatures);
      cmd._M_dataplus._M_p = &options.field_0xb0;
      cmd.field_2._8_8_ = 0;
      local_638 = 0;
      local_620 = 0;
      local_618 = 0;
      local_600 = 0;
      local_5f8 = 0;
      local_660 = (size_type *)((ulong)local_660 & 0xffffffffffffff00);
      cmd._M_string_length = CONCAT62(cmd._M_string_length._2_6_,1);
      local_808[0] = local_7f8;
      cmd.field_2._M_allocated_capacity = (size_type)&local_638;
      local_628 = &local_618;
      local_608 = &local_5f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_808,WasmReduceOption.field_2._8_8_,
                 test._M_dataplus._M_p + WasmReduceOption.field_2._8_8_);
      wasm::ModuleWriter::write(&local_660,&options.enabledFeatures,local_808);
      if (local_808[0] != local_7f8) {
        operator_delete(local_808[0],local_7f8[0] + 1);
      }
      local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7e8,resultOnValid.time,
                 command._M_dataplus._M_p + (long)resultOnValid.time);
      ProgramResult::ProgramResult((ProgramResult *)((long)&input.field_2 + 8),&local_7e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
        operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
      }
      bVar2 = ProgramResult::operator==((ProgramResult *)((long)&input.field_2 + 8),&expected);
      if (bVar2) {
        wasm::Fatal::Fatal((Fatal *)local_bf0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&test.field_2 + 8),
                       "running the command on the given input gives the same result as when running it on either a trivial valid wasm or a file with nonsense in it. does the script not look at the test file ("
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&WasmReduceOption.field_2 + 8));
        plVar6 = (long *)std::__cxx11::string::append(test.field_2._M_local_buf + 8);
        working.field_2._8_8_ = *plVar6;
        psVar12 = (size_type *)(plVar6 + 2);
        if ((size_type *)working.field_2._8_8_ == psVar12) {
          local_58._M_allocated_capacity = *psVar12;
          local_58._8_8_ = plVar6[3];
          working.field_2._8_8_ = &local_58;
        }
        else {
          local_58._M_allocated_capacity = *psVar12;
        }
        *plVar6 = (long)psVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        wasm::Fatal::operator<<
                  ((Fatal *)local_bf0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&working.field_2 + 8));
        std::__cxx11::string::~string((string *)(working.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(test.field_2._M_local_buf + 8));
        wasm::Fatal::~Fatal((Fatal *)local_bf0);
      }
      if ((size_type *)resultOnValid._0_8_ != &resultOnValid.output._M_string_length) {
        operator_delete((void *)resultOnValid._0_8_,resultOnValid.output._M_string_length + 1);
      }
      if (local_608 != &local_5f8) {
        operator_delete(local_608,CONCAT71(uStack_5f7,local_5f8) + 1);
      }
      if (local_628 != &local_618) {
        operator_delete(local_628,CONCAT71(uStack_617,local_618) + 1);
      }
      if ((undefined1 *)cmd.field_2._M_allocated_capacity != &local_638) {
        operator_delete((void *)cmd.field_2._M_allocated_capacity,CONCAT71(uStack_637,local_638) + 1
                       );
      }
      wasm::Module::~Module((Module *)&options.enabledFeatures);
    }
    if ((size_type *)resultOnInvalid._0_8_ != &resultOnInvalid.output._M_string_length) {
      operator_delete((void *)resultOnInvalid._0_8_,resultOnInvalid.output._M_string_length + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "|checking that command has expected behavior on canonicalized (read-written) binary\n"
             ,0x54);
  local_1c8 = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"wasm-opt","");
  wasm::Path::getBinaryenBinaryTool((string *)(test.field_2._M_local_buf + 8));
  plVar6 = (long *)std::__cxx11::string::append(test.field_2._M_local_buf + 8);
  psVar10 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar10) {
    local_58._M_allocated_capacity = *psVar10;
    local_58._8_8_ = plVar6[3];
    working.field_2._8_8_ = &local_58;
  }
  else {
    local_58._M_allocated_capacity = *psVar10;
    working.field_2._8_8_ = (size_type *)*plVar6;
  }
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             (working.field_2._M_local_buf + 8,(ulong)local_158);
  input.field_2._8_8_ = &resultOnValid.output;
  plVar11 = plVar6 + 2;
  if ((long *)*plVar6 == plVar11) {
    resultOnValid.output._M_dataplus._M_p = (pointer)*plVar11;
    resultOnValid.output._M_string_length = plVar6[3];
  }
  else {
    resultOnValid.output._M_dataplus._M_p = (pointer)*plVar11;
    input.field_2._8_8_ = (long *)*plVar6;
  }
  resultOnValid._0_8_ = plVar6[1];
  *plVar6 = (long)plVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append(input.field_2._M_local_buf + 8);
  plVar11 = plVar6 + 2;
  if ((string *)*plVar6 == (string *)plVar11) {
    resultOnInvalid.output._M_dataplus._M_p = (pointer)*plVar11;
    resultOnInvalid.output._M_string_length = plVar6[3];
    local_1a8 = (undefined1  [8])&resultOnInvalid.output;
  }
  else {
    resultOnInvalid.output._M_dataplus._M_p = (pointer)*plVar11;
    local_1a8 = (undefined1  [8])*plVar6;
  }
  resultOnInvalid._0_8_ = plVar6[1];
  *plVar6 = (long)plVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append(local_1a8,WasmReduceOption.field_2._8_8_);
  local_bf0 = (undefined1  [8])&result.output;
  plVar11 = plVar6 + 2;
  if ((string *)*plVar6 == (string *)plVar11) {
    result.output._M_dataplus._M_p = (pointer)*plVar11;
    result.output._M_string_length = plVar6[3];
  }
  else {
    result.output._M_dataplus._M_p = (pointer)*plVar11;
    local_bf0 = (undefined1  [8])*plVar6;
  }
  result._0_8_ = plVar6[1];
  *plVar6 = (long)plVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append(local_bf0);
  plVar11 = plVar6 + 2;
  if ((long *)*plVar6 == plVar11) {
    local_fd0 = *plVar11;
    aaStack_fc8[0]._0_8_ = plVar6[3];
    options._376_8_ = &local_fd0;
  }
  else {
    local_fd0 = *plVar11;
    options._376_8_ = (long *)*plVar6;
  }
  _dst = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)plVar6[1];
  *plVar6 = (long)plVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&options.enabledFeatures,
                              (ulong)extraFlags_abi_cxx11_._M_dataplus._M_p);
  psVar10 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar10) {
    cmd._M_string_length = *psVar10;
    cmd.field_2._M_allocated_capacity = plVar6[3];
    local_660 = psVar12;
  }
  else {
    cmd._M_string_length = *psVar10;
    local_660 = (size_type *)*plVar6;
  }
  cmd._M_dataplus._M_p = (pointer)plVar6[1];
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((long *)options._376_8_ != &local_fd0) {
    operator_delete((void *)options._376_8_,local_fd0 + 1);
  }
  if (local_bf0 != (undefined1  [8])&result.output) {
    operator_delete((void *)local_bf0,(ulong)(result.output._M_dataplus._M_p + 1));
  }
  if (local_1a8 != (undefined1  [8])&resultOnInvalid.output) {
    operator_delete((void *)local_1a8,(ulong)(resultOnInvalid.output._M_dataplus._M_p + 1));
  }
  if ((string *)input.field_2._8_8_ != &resultOnValid.output) {
    operator_delete((void *)input.field_2._8_8_,(ulong)(resultOnValid.output._M_dataplus._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)working.field_2._8_8_ != &local_58) {
    operator_delete((void *)working.field_2._8_8_,local_58._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test.field_2._8_8_ != &local_98) {
    operator_delete((void *)test.field_2._8_8_,local_98._M_allocated_capacity + 1);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,(ulong)(local_1b8 + 1));
  }
  if (local_31[0] == false) {
    std::__cxx11::string::append((char *)&local_660);
  }
  local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7c8,local_660,cmd._M_dataplus._M_p + (long)local_660);
  ProgramResult::ProgramResult((ProgramResult *)&options.enabledFeatures,&local_7c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
  }
  if (options.enabledFeatures.features == 0) {
    local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_788,resultOnValid.time,
               command._M_dataplus._M_p + (long)resultOnValid.time);
    ProgramResult::ProgramResult((ProgramResult *)local_bf0,&local_788);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_788._M_dataplus._M_p != &local_788.field_2) {
      operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
    }
    bVar2 = ProgramResult::operator==((ProgramResult *)local_bf0,&expected);
    if (!bVar2) {
      local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_768,
                 "running command on the canonicalized module should give the same results","");
      main::anon_class_8_1_a7eb7a0b::operator()
                ((anon_class_8_1_a7eb7a0b *)&resultOnInvalid.time,&local_768,
                 (ProgramResult *)local_bf0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_768._M_dataplus._M_p != &local_768.field_2) {
        operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
      }
    }
    local_7a8.field_2._M_allocated_capacity = result.output._M_string_length;
    _Var14._M_p = (pointer)result._0_8_;
    if ((size_type *)result._0_8_ == &result.output._M_string_length) goto LAB_001127f3;
  }
  else {
    local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_7a8,"failed to read and write the binary","");
    main::anon_class_8_1_a7eb7a0b::operator()
              ((anon_class_8_1_a7eb7a0b *)&resultOnInvalid.time,&local_7a8,
               (ProgramResult *)&options.enabledFeatures);
    _Var14._M_p = local_7a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7a8._M_dataplus._M_p == &local_7a8.field_2) goto LAB_001127f3;
  }
  operator_delete(_Var14._M_p,local_7a8.field_2._M_allocated_capacity + 1);
LAB_001127f3:
  if (_dst != aaStack_fc8) {
    operator_delete(_dst,aaStack_fc8[0]._0_8_ + 1);
  }
  if (local_660 != psVar12) {
    operator_delete(local_660,cmd._M_string_length + 1);
  }
  local_748[0] = local_738;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_748,local_158,input._M_dataplus._M_p + (long)local_158);
  local_728[0] = local_718;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_728,local_88,working._M_dataplus._M_p + (long)local_88);
  wasm::copy_file(local_748,local_728);
  if (local_728[0] != local_718) {
    operator_delete(local_728[0],local_718[0] + 1);
  }
  if (local_748[0] != local_738) {
    operator_delete(local_748[0],local_738[0] + 1);
  }
  local_708[0] = local_6f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_708,local_88,working._M_dataplus._M_p + (long)local_88);
  uVar7 = wasm::file_size(local_708);
  if (local_708[0] != local_6f8) {
    operator_delete(local_708[0],local_6f8[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"|input size: ",0xd);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"|starting reduction!\n",0x15);
  if (local_31[0] == true) {
    uVar7 = uVar7 * 2;
  }
  else {
    uVar7 = uVar7 / 10;
  }
  uVar13 = 0;
  local_48 = (char **)((ulong)local_48 & 0xffffffff00000000);
  sVar9 = 0;
  do {
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_248,resultOnValid.time,
               command._M_dataplus._M_p + (long)resultOnValid.time);
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    binDir.field_2._8_8_ = uVar13;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_228,WasmReduceOption.field_2._8_8_,
               test._M_dataplus._M_p + WasmReduceOption.field_2._8_8_);
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_288,local_88,working._M_dataplus._M_p + (long)local_88);
    Reducer::Reducer((Reducer *)&options.enabledFeatures,&local_248,&local_228,&local_288,
                     local_31[0],local_35,local_34,local_33,(ToolOptions *)local_1160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"|  reduce using passes...\n",0x1a);
    local_208[0] = local_1f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_208,local_88,working._M_dataplus._M_p + (long)local_88);
    lVar8 = wasm::file_size(local_208);
    if (local_208[0] != local_1f8) {
      operator_delete(local_208[0],local_1f8[0] + 1);
    }
    Reducer::reduceUsingPasses((Reducer *)&options.enabledFeatures);
    local_268[0] = local_258;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_268,local_88,working._M_dataplus._M_p + (long)local_88);
    local_40 = wasm::file_size((string *)local_268);
    if (local_268[0] != local_258) {
      operator_delete(local_268[0],local_258[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"|  after pass reduction: ",0x19);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if (((ulong)local_48 & 1) != 0) {
      Reducer::~Reducer((Reducer *)&options.enabledFeatures);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"|finished, final size: ",0x17);
      local_6e8[0] = local_6d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_6e8,local_88,working._M_dataplus._M_p + (long)local_88);
      wasm::file_size(local_6e8);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if (local_6e8[0] != local_6d8) {
        operator_delete(local_6e8[0],local_6d8[0] + 1);
      }
      local_6c8[0] = local_6b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_6c8,local_88,working._M_dataplus._M_p + (long)local_88);
      local_6a8[0] = local_698;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_6a8,WasmReduceOption.field_2._8_8_,
                 test._M_dataplus._M_p + WasmReduceOption.field_2._8_8_);
      wasm::copy_file(local_6c8,local_6a8);
      if (local_6a8[0] != local_698) {
        operator_delete(local_6a8[0],local_698[0] + 1);
      }
      if (local_6c8[0] != local_6b8) {
        operator_delete(local_6c8[0],local_6b8[0] + 1);
      }
      wasm::ToolOptions::~ToolOptions((ToolOptions *)local_1160);
      if ((size_type *)command.field_2._8_8_ != &WasmReduceOption._M_string_length) {
        operator_delete((void *)command.field_2._8_8_,WasmReduceOption._M_string_length + 1);
      }
      if ((size_type *)local_688 != &binDir._M_string_length) {
        operator_delete(local_688,binDir._M_string_length + 1);
      }
      if ((size_type *)resultOnValid.time != &command._M_string_length) {
        operator_delete((void *)resultOnValid.time,
                        CONCAT71(command._M_string_length._1_7_,(undefined1)command._M_string_length
                                ) + 1);
      }
      if (local_88 != &working._M_string_length) {
        operator_delete(local_88,CONCAT71(working._M_string_length._1_7_,
                                          (undefined1)working._M_string_length) + 1);
      }
      if ((size_type *)WasmReduceOption.field_2._8_8_ != &test._M_string_length) {
        operator_delete((void *)WasmReduceOption.field_2._8_8_,
                        CONCAT71(test._M_string_length._1_7_,(undefined1)test._M_string_length) + 1)
        ;
      }
      if (local_158 != &input._M_string_length) {
        operator_delete(local_158,
                        CONCAT71(input._M_string_length._1_7_,(undefined1)input._M_string_length) +
                        1);
      }
      return 0;
    }
    if (binDir.field_2._8_8_ - 1 < local_40) {
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,"|  progress has stopped, skipping to the end\n",
                          0x2d);
      iVar15 = (int)uVar7;
      if (iVar15 != 1) {
        uVar7 = (ulong)(uint)((iVar15 - (iVar15 + 1 >> 0x1f)) + 1 >> 1);
        goto LAB_00112c15;
      }
      local_48 = (char **)CONCAT44(local_48._4_4_,(int)CONCAT71((int7)((ulong)poVar5 >> 8),1));
      uVar7 = 1;
    }
    else {
LAB_00112c15:
      local_48 = (char **)((ulong)local_48 & 0xffffffff00000000);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"|  pass progress: ",0x12);
    uVar13 = lVar8 - local_40;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", last destructive: ",0x14);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    local_bf0[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_bf0,1);
    iVar15 = (int)uVar7;
    if (uVar13 < sVar9 << 2) {
      if (iVar15 < 0xb) {
        uVar3 = (iVar15 - (iVar15 + 1 >> 0x1f)) + 1 >> 1;
      }
      else {
        uVar3 = (int)((uVar7 & 0xffffffff) / 3) + 1;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"|  progress is good, do not quickly decrease factor\n",0x34)
      ;
      uVar3 = (iVar15 * 9) / 10;
      if ((int)uVar3 < 2) {
        uVar3 = 1;
      }
    }
    if (local_40 < 5) {
      __assert_fail("newSize > 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp"
                    ,0x624,"int main(int, const char **)");
    }
    iVar15 = (int)local_40;
    iVar16 = iVar15 + 3;
    if (-1 < iVar15) {
      iVar16 = iVar15;
    }
    uVar7 = (ulong)(uint)(iVar16 >> 2);
    if ((int)uVar3 <= iVar16 >> 2) {
      uVar7 = (ulong)uVar3;
    }
    while( true ) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"|  reduce destructively... (factor: ",0x24);
      iVar15 = (int)uVar7;
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,")\n",2);
      sVar9 = Reducer::reduceDestructively((Reducer *)&options.enabledFeatures,iVar15);
      if (sVar9 != 0) break;
      if (iVar15 == 1) {
        local_48 = (char **)CONCAT44(local_48._4_4_,1);
        uVar7 = 1;
        break;
      }
      iVar16 = iVar15 + 3;
      if (-1 < iVar15) {
        iVar16 = iVar15;
      }
      uVar3 = iVar16 >> 2;
      if ((int)uVar3 < 2) {
        uVar3 = 1;
      }
      uVar7 = (ulong)uVar3;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"|  destructive reduction led to size: ",0x26);
    local_1e8[0] = local_1d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1e8,local_88,working._M_dataplus._M_p + (long)local_88);
    wasm::file_size(local_1e8);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    local_bf0[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_bf0,1);
    uVar13 = local_40;
    if (local_1e8[0] != local_1d8) {
      operator_delete(local_1e8[0],local_1d8[0] + 1);
    }
    Reducer::~Reducer((Reducer *)&options.enabledFeatures);
  } while( true );
}

Assistant:

int main(int argc, const char* argv[]) {
  std::string input, test, working, command;
  // By default, look for binaries alongside our own binary.
  std::string binDir = Path::getDirName(argv[0]);
  bool binary = true, deNan = false, verbose = false, debugInfo = false,
       force = false;

  const std::string WasmReduceOption = "wasm-reduce options";

  ToolOptions options(
    "wasm-reduce",
    R"(Reduce a wasm file to a smaller one with the same behavior on a given command.

Typical usage:

  wasm-reduce orig.wasm '--command=bash a.sh' --test t.wasm --working w.wasm

The original file orig.wasm is where we begin. We then repeatedly test a small
reduction of it by writing that modification to the 'test file' (specified by
'--test'), and we run the command, in this example 'bash a.sh'. That command
should use the test file (and not the original file or any other one). Whenever
the reduction works, we write that new smaller file to the 'working file'
(specified by '--working'). The reduction 'works' if it correctly preserves the
behavior of the command on the original input, specifically, that it has the
same stdout and the result return code. Each time reduction works we continue to
reduce from that point (and each time it fails, we go back and try something
else).

As mentioned above, the command should run on the test file. That is, the first
thing that wasm-reduce does on the example above is, effectively,

  cp orig.wasm t.wasm
  bash a.sh

In other words, it copies the original to the test file, and runs the command.
Whatever the command does, we will preserve as we copy progressively smaller
files to t.wasm. As we make progress, the smallest file will be written to
the working file, w.wasm, and when reduction is done you will find the final
result there.

Comparison to creduce:

1. creduce requires the command to return 0. wasm-reduce is often used to reduce
   crashes, which have non-zero return codes, so it is natural to allow any
   return code. As mentioned above, we preserve the return code as we reduce.
2. creduce ignores stdout. wasm-reduce preserves stdout as it reduces, as part
   of the principle of preserving the original behavior of the command (if your
   stdout varies in uninteresting ways, your command can be a script that runs
   the real command and captures stdout to /dev/null, or filters it).
3. creduce tramples the original input file as it reduces. wasm-reduce never
   modifies the input (to avoid mistakes that cause data loss). Instead,
   when reductions work we write to the 'working file' as mentioned above, and
   the final reduction will be there.
4. creduce runs the command in a temp directory. That is safer in general, but
   it is not how the original command ran, and in particular forces additional
   work if you have multiple files (which, for wasm-reduce, is common, e.g. if
   the testcase is a combination of JavaScript and wasm). wasm-reduce runs the
   command in the current directory (of course, your command can be a script
   that changes directory to anywhere else).

More documentation can be found at

  https://github.com/WebAssembly/binaryen/wiki/Fuzzing#reducing
                      )");
  options
    .add("--command",
         "-cmd",
         "The command to run on the test, that we want to reduce while keeping "
         "the command's output identical. "
         "We look at the command's return code and stdout here (TODO: stderr), "
         "and we reduce while keeping those unchanged.",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { command = argument; })
    .add("--test",
         "-t",
         "Test file (this will be written to test, the given command should "
         "read it when we call it)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { test = argument; })
    .add("--working",
         "-w",
         "Working file (this will contain the current good state while doing "
         "temporary computations, "
         "and will contain the final best result at the end)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { working = argument; })
    .add("--binaries",
         "-b",
         "binaryen binaries location (bin/ directory)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           // Add separator just in case
           binDir = argument + Path::getPathSeparator();
         })
    .add("--text",
         "-S",
         "Emit intermediate files as text, instead of binary (also make sure "
         "the test and working files have a .wat or .wast suffix)",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { binary = false; })
    .add("--denan",
         "",
         "Avoid nans when reducing",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { deNan = true; })
    .add("--verbose",
         "-v",
         "Verbose output mode",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { verbose = true; })
    .add("--debugInfo",
         "-g",
         "Keep debug info in binaries",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { debugInfo = true; })
    .add("--force",
         "-f",
         "Force the reduction attempt, ignoring problems that imply it is "
         "unlikely to succeed",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { force = true; })
    .add("--timeout",
         "-to",
         "A timeout to apply to each execution of the command, in seconds "
         "(default: 2)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           timeout = atoi(argument.c_str());
           std::cout << "|applying timeout: " << timeout << "\n";
         })
    .add("--extra-flags",
         "-ef",
         "Extra commandline flags to pass to wasm-opt while reducing. "
         "(default: --enable-all)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           extraFlags = argument;
           std::cout << "|applying extraFlags: " << extraFlags << "\n";
         })
    .add("--save-all-working",
         "-saw",
         "Save all intermediate working files, as $WORKING.0, .1, .2 etc",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) {
           saveAllWorkingFiles = true;
           std::cout << "|saving all intermediate working files\n";
         })
    .add_positional(
      "INFILE",
      Options::Arguments::One,
      [&](Options* o, const std::string& argument) { input = argument; });
  options.parse(argc, argv);

  if (debugInfo) {
    extraFlags += " -g ";
  }

  if (test.size() == 0) {
    Fatal() << "test file not provided\n";
  }
  if (working.size() == 0) {
    Fatal() << "working file not provided\n";
  }

  if (!binary) {
    Colors::setEnabled(false);
  }

  Path::setBinaryenBinDir(binDir);

  std::cerr << "|wasm-reduce\n";
  std::cerr << "|input: " << input << '\n';
  std::cerr << "|test: " << test << '\n';
  std::cerr << "|working: " << working << '\n';
  std::cerr << "|bin dir: " << binDir << '\n';
  std::cerr << "|extra flags: " << extraFlags << '\n';

  // get the expected output
  copy_file(input, test);
  expected.getFromExecution(command);

  std::cerr << "|expected result:\n" << expected << '\n';
  std::cerr << "|!! Make sure the above is what you expect! !!\n\n";

  auto stopIfNotForced = [&](std::string message, ProgramResult& result) {
    std::cerr << "|! " << message << '\n' << result << '\n';
    if (!force) {
      Fatal() << "|! stopping, as it is very unlikely reduction can succeed "
                 "(use -f to ignore this check)";
    }
  };

  if (expected.time + 1 >= timeout) {
    stopIfNotForced("execution time is dangerously close to the timeout - you "
                    "should probably increase the timeout",
                    expected);
  }

  if (!force) {
    std::cerr << "|checking that command has different behavior on different "
                 "inputs (this "
                 "verifies that the test file is used by the command)\n";
    // Try it on an invalid input.
    {
      std::ofstream dst(test, std::ios::binary);
      dst << "waka waka\n";
    }
    ProgramResult resultOnInvalid(command);
    if (resultOnInvalid == expected) {
      // Try it on a valid input.
      Module emptyModule;
      ModuleWriter writer(options.passOptions);
      writer.setBinary(true);
      writer.write(emptyModule, test);
      ProgramResult resultOnValid(command);
      if (resultOnValid == expected) {
        Fatal()
          << "running the command on the given input gives the same result as "
             "when running it on either a trivial valid wasm or a file with "
             "nonsense in it. does the script not look at the test file (" +
               test + ")? (use -f to ignore this check)";
      }
    }
  }

  std::cerr << "|checking that command has expected behavior on canonicalized "
               "(read-written) binary\n";
  {
    // read and write it
    auto cmd = Path::getBinaryenBinaryTool("wasm-opt") + " " + input + " -o " +
               test + " " + extraFlags;
    if (!binary) {
      cmd += " -S ";
    }
    ProgramResult readWrite(cmd);
    if (readWrite.failed()) {
      stopIfNotForced("failed to read and write the binary", readWrite);
    } else {
      ProgramResult result(command);
      if (result != expected) {
        stopIfNotForced("running command on the canonicalized module should "
                        "give the same results",
                        result);
      }
    }
  }

  copy_file(input, working);
  auto workingSize = file_size(working);
  std::cerr << "|input size: " << workingSize << "\n";

  std::cerr << "|starting reduction!\n";

  int factor = binary ? workingSize * 2 : workingSize / 10;

  size_t lastDestructiveReductions = 0;
  size_t lastPostPassesSize = 0;

  bool stopping = false;

  while (1) {
    Reducer reducer(
      command, test, working, binary, deNan, verbose, debugInfo, options);

    // run binaryen optimization passes to reduce. passes are fast to run
    // and can often reduce large amounts of code efficiently, as opposed
    // to detructive reduction (i.e., that doesn't preserve correctness as
    // passes do) since destrucive must operate one change at a time
    std::cerr << "|  reduce using passes...\n";
    auto oldSize = file_size(working);
    reducer.reduceUsingPasses();
    auto newSize = file_size(working);
    auto passProgress = oldSize - newSize;
    std::cerr << "|  after pass reduction: " << newSize << "\n";

    // always stop after a pass reduction attempt, for final cleanup
    if (stopping) {
      break;
    }

    // check if the full cycle (destructive/passes) has helped or not
    if (lastPostPassesSize && newSize >= lastPostPassesSize) {
      std::cerr << "|  progress has stopped, skipping to the end\n";
      if (factor == 1) {
        // this is after doing work with factor 1, so after the remaining work,
        // stop
        stopping = true;
      } else {
        // decrease the factor quickly
        factor = (factor + 1) / 2; // stable on 1
      }
    }
    lastPostPassesSize = newSize;

    // If destructive reductions lead to useful proportionate pass reductions,
    // keep going at the same factor, as pass reductions are far faster.
    std::cerr << "|  pass progress: " << passProgress
              << ", last destructive: " << lastDestructiveReductions << '\n';
    if (passProgress >= 4 * lastDestructiveReductions) {
      std::cerr << "|  progress is good, do not quickly decrease factor\n";
      // While the amount of pass reductions is proportionately high, we do
      // still want to reduce the factor by some amount. If we do not then there
      // is a risk that both pass and destructive reductions are very low, and
      // we get "stuck" cycling through them. In that case we simply need to do
      // more destructive reductions to make real progress. For that reason,
      // decrease the factor by some small percentage.
      factor = std::max(1, (factor * 9) / 10);
    } else {
      if (factor > 10) {
        factor = (factor / 3) + 1;
      } else {
        factor = (factor + 1) / 2; // stable on 1
      }
    }

    // no point in a factor lorger than the size
    assert(newSize > 4); // wasm modules are >4 bytes anyhow
    factor = std::min(factor, int(newSize) / 4);

    // try to reduce destructively. if a high factor fails to find anything,
    // quickly try a lower one (no point in doing passes until we reduce
    // destructively at least a little)
    while (1) {
      std::cerr << "|  reduce destructively... (factor: " << factor << ")\n";
      lastDestructiveReductions = reducer.reduceDestructively(factor);
      if (lastDestructiveReductions > 0) {
        break;
      }
      // we failed to reduce destructively
      if (factor == 1) {
        stopping = true;
        break;
      }
      factor = std::max(
        1, factor / 4); // quickly now, try to find *something* we can reduce
    }

    std::cerr << "|  destructive reduction led to size: " << file_size(working)
              << '\n';
  }
  std::cerr << "|finished, final size: " << file_size(working) << "\n";
  copy_file(working, test); // just to avoid confusion
}